

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

fft_plan *
sptk::world::fft_plan_dft_c2r_1d
          (fft_plan *__return_storage_ptr__,int n,fft_complex *in,double *out,uint flags)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  int *ip;
  int nw;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = 0xffffffffffffffff;
  uVar5 = (long)((n * 5) / 4) << 3;
  if (n < 0) {
    uVar5 = uVar1;
  }
  uVar4 = (long)n * 4;
  if (n < 0) {
    uVar4 = uVar1;
  }
  uVar2 = (long)n << 3;
  if (n < 0) {
    uVar2 = uVar1;
  }
  *(undefined8 *)&__return_storage_ptr__->flags = 0;
  __return_storage_ptr__->n = n;
  __return_storage_ptr__->in = (double *)0x0;
  __return_storage_ptr__->c_out = (fft_complex *)0x0;
  __return_storage_ptr__->c_in = in;
  __return_storage_ptr__->out = out;
  __return_storage_ptr__->sign = 2;
  __return_storage_ptr__->flags = flags;
  pdVar3 = (double *)operator_new__(uVar2);
  __return_storage_ptr__->input = pdVar3;
  ip = (int *)operator_new__(uVar4);
  __return_storage_ptr__->ip = ip;
  pdVar3 = (double *)operator_new__(uVar5);
  __return_storage_ptr__->w = pdVar3;
  *ip = 0;
  nw = n >> 2;
  makewt(nw,ip,pdVar3);
  makect(nw,ip,pdVar3 + nw);
  return __return_storage_ptr__;
}

Assistant:

fft_plan fft_plan_dft_c2r_1d(int n, fft_complex *in, double *out,
    unsigned int flags) {
#if 0
  void makewt(int nw, int *ip, double *w);
  void makect(int nc, int *ip, double *c);
#endif

  fft_plan output = {0};
  output.n = n;
  output.in = NULL;
  output.c_in = in;
  output.out = out;
  output.c_out = NULL;
  output.sign = FFT_BACKWARD;
  output.flags = flags;
  output.input = new double[n];
  output.ip = new int[n];
  output.w = new double[n * 5 / 4];

  output.ip[0] = 0;
  makewt(output.n >> 2, output.ip, output.w);
  makect(output.n >> 2, output.ip, output.w + (output.n >> 2));
  return output;
}